

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_info.cpp
# Opt level: O0

sha256_hash * __thiscall
libtorrent::v1_2::peer_info::i2p_destination(sha256_hash *__return_storage_ptr__,peer_info *this)

{
  bool bVar1;
  char *__dest;
  size_t __n;
  char *destination;
  uint local_14;
  peer_info *local_10;
  peer_info *this_local;
  
  local_10 = this;
  digest32<256L>::digest32(__return_storage_ptr__);
  local_14 = (uint)libtorrent::flags::operator&
                             ((bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)
                              (this->flags).m_val,
                              (bitfield_flag<unsigned_int,_libtorrent::peer_flags_tag,_void>)0x10000
                             );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_14);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __dest = digest32<256L>::data(__return_storage_ptr__);
    __n = digest32<256L>::size();
    memcpy(__dest,&this->ip,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

sha256_hash peer_info::i2p_destination() const
	{
		sha256_hash ret;
		if (!(flags & i2p_socket)) return ret;

		char const* destination = reinterpret_cast<char const*>(&ip);
		static_assert(sizeof(tcp::endpoint) * 2 >= sizeof(sha256_hash), "tcp::endpoint is smaller than expected");

		std::memcpy(ret.data(), destination, ret.size());
		return ret;
	}